

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_lock_wrapper.h
# Opt level: O0

void __thiscall webrtc::RWLockWrapper::RWLockWrapper(RWLockWrapper *this)

{
  RWLockWrapper *this_local;
  
  this->_vptr_RWLockWrapper = (_func_int **)&PTR__RWLockWrapper_002fcc68;
  return;
}

Assistant:

class LOCKABLE RWLockWrapper {
 public:
  static RWLockWrapper* CreateRWLock();
  virtual ~RWLockWrapper() {}

  virtual void AcquireLockExclusive() EXCLUSIVE_LOCK_FUNCTION() = 0;
  virtual void ReleaseLockExclusive() UNLOCK_FUNCTION() = 0;

  virtual void AcquireLockShared() SHARED_LOCK_FUNCTION() = 0;
  virtual void ReleaseLockShared() UNLOCK_FUNCTION() = 0;
}